

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::CrossingProcessor
          (CrossingProcessor *this,PolygonModel *polygon_model,PolylineModel *polyline_model,
          bool polyline_loops_have_boundaries,S2Builder *builder,
          vector<signed_char,_std::allocator<signed_char>_> *input_dimensions,
          InputEdgeCrossings *input_crossings)

{
  vector<signed_char,_std::allocator<signed_char>_> *input_dimensions_local;
  S2Builder *builder_local;
  bool polyline_loops_have_boundaries_local;
  PolylineModel *polyline_model_local;
  PolygonModel *polygon_model_local;
  CrossingProcessor *this_local;
  
  this->polygon_model_ = *polygon_model;
  this->polyline_model_ = *polyline_model;
  this->polyline_loops_have_boundaries_ = polyline_loops_have_boundaries;
  this->builder_ = builder;
  this->input_dimensions_ = input_dimensions;
  this->input_crossings_ = input_crossings;
  std::
  vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
  ::vector(&this->source_edge_crossings_);
  gtl::
  btree_map<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256>
  ::btree_map(&this->source_id_map_);
  this->prev_inside_ = false;
  return;
}

Assistant:

CrossingProcessor(const PolygonModel& polygon_model,
                    const PolylineModel& polyline_model,
                    bool polyline_loops_have_boundaries,
                    S2Builder* builder,
                    vector<int8>* input_dimensions,
                    InputEdgeCrossings *input_crossings)
      : polygon_model_(polygon_model), polyline_model_(polyline_model),
        polyline_loops_have_boundaries_(polyline_loops_have_boundaries),
        builder_(builder), input_dimensions_(input_dimensions),
        input_crossings_(input_crossings), prev_inside_(false) {
  }